

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_names.cc
# Opt level: O2

bool prometheus::CheckLabelName(string *name,MetricType type)

{
  _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::__0>
  *p_Var1;
  bool bVar2;
  _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::__0>
  *this;
  undefined4 in_register_00000034;
  char *__it;
  size_type sVar3;
  long lVar4;
  _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::__0>
  *p_Var5;
  
  __it = (char *)CONCAT44(in_register_00000034,type);
  bVar2 = anon_unknown_3::nameStartsValid(name);
  if (!bVar2) {
    return false;
  }
  if (type == Summary) {
    __it = "quantile";
LAB_001558cb:
    bVar2 = std::operator==(name,__it);
    if (bVar2) {
      return false;
    }
  }
  else if (type == Histogram) {
    __it = "le";
    goto LAB_001558cb;
  }
  this = (_Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::__0>
          *)(name->_M_dataplus)._M_p;
  sVar3 = name->_M_string_length;
  p_Var1 = this + sVar3;
  for (lVar4 = (long)sVar3 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::$_0>
            ::operator()(this,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )__it);
    p_Var5 = this;
    if (bVar2) goto LAB_00155982;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::$_0>
            ::operator()(this + 1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )__it);
    p_Var5 = this + 1;
    if (bVar2) goto LAB_00155982;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::$_0>
            ::operator()(this + 2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )__it);
    p_Var5 = this + 2;
    if (bVar2) goto LAB_00155982;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::$_0>
            ::operator()(this + 3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )__it);
    p_Var5 = this + 3;
    if (bVar2) goto LAB_00155982;
    this = this + 4;
    sVar3 = sVar3 - 4;
  }
  if (sVar3 != 1) {
    if (sVar3 != 2) {
      p_Var5 = p_Var1;
      if ((sVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::$_0>
                  ::operator()(this,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )__it), p_Var5 = this, bVar2)) goto LAB_00155982;
      this = this + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::$_0>
            ::operator()(this,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )__it);
    p_Var5 = this;
    if (bVar2) goto LAB_00155982;
    this = this + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_negate<prometheus::CheckLabelName(std::__cxx11::string_const&,prometheus::MetricType)::$_0>
          ::operator()(this,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )__it);
  p_Var5 = this;
  if (!bVar2) {
    p_Var5 = p_Var1;
  }
LAB_00155982:
  return p_Var5 == p_Var1;
}

Assistant:

bool CheckLabelName(const std::string& name, MetricType type) {
  if (!nameStartsValid(name)) {
    return false;
  }

  auto validLabelCharacters = [](char c) {
    return isLocaleIndependentAlphaNumeric(c) || c == '_';
  };

  if ((type == MetricType::Histogram && name == "le") ||
      (type == MetricType::Summary && name == "quantile")) {
    return false;
  }

  auto mismatch =
      std::find_if_not(std::begin(name), std::end(name), validLabelCharacters);
  return mismatch == std::end(name);
}